

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  exception *e;
  Client client;
  io_context io_context;
  string local_70 [8];
  string path;
  allocator local_39;
  string local_38 [8];
  string host;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,(allocator *)((long)&io_context.impl_ + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&io_context.impl_ + 7));
    boost::asio::io_context::io_context
              ((io_context *)
               &client.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    Client::Client((Client *)&e,
                   (io_context *)
                   &client.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    field_0x10,(string *)local_38,(string *)local_70);
    boost::asio::io_context::run
              ((io_context *)
               &client.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    Client::~Client((Client *)&e);
    boost::asio::io_context::~io_context
              ((io_context *)
               &client.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    Help(*argv);
  }
  argv_local._4_4_ = (uint)(argc != 3);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc != 3) {
    Help(argv[0]);
    return 1;
  }

  std::string host = argv[1];
  std::string path = argv[2];

  try {
    boost::asio::io_context io_context;

    Client client(io_context, host, path);

    io_context.run();

  } catch (const std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}